

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O0

void mp::WriteJSON<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
               (JSONW *jw,
               IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
               *ic)

{
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_> *in_RSI;
  char *in_RDI;
  int *in_stack_ffffffffffffff58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff60;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *this;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffffc8;
  JSONW *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  int local_14;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_> *local_10;
  
  local_10 = in_RSI;
  local_14 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>
             ::get_binary_var(in_RSI);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff70,in_RDI);
  this_00 = &local_28;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x268a83);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
  get_binary_value(local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  this = (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
         &stack0xffffffffffffffa8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (this,in_stack_ffffffffffffff58);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x268ade);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>::
  get_constraint(local_10);
  WriteJSON<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x268b31);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const IndicatorConstraint<Con>& ic) {
  jw["bin_var"] = ic.get_binary_var();
  jw["bin_val"] = ic.get_binary_value();
  WriteJSON(jw["con"], ic.get_constraint());
}